

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_Next_PIXELAD(void)

{
  char *pcVar1;
  Z80Reg ZVar2;
  char *oldLp;
  
  pcVar1 = ::lp;
  if (DAT_001e16a8._4_4_ < 1) {
    Error("Z80N instructions are currently disabled",bp,SUPPRESS);
  }
  else {
    ZVar2 = GetRegister(&::lp);
    if (ZVar2 != Z80_HL) {
      ::lp = pcVar1;
    }
    EmitByte(0xed,true);
    EmitByte(0x94,false);
  }
  return;
}

Assistant:

static void OpCode_Next_PIXELAD() {
		if (Options::syx.IsNextEnabled < 1) {
			Error("Z80N instructions are currently disabled", bp, SUPPRESS);
			return;
		}
		char *oldLp = lp;
		if (Z80_HL != GetRegister(lp)) lp = oldLp;		// "eat" explicit HL argument
		EmitByte(0xED, true);
		EmitByte(0x94);
	}